

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lup_matrix.cpp
# Opt level: O0

string * __thiscall LUPMatrix::ToLaTex_abi_cxx11_(string *__return_storage_ptr__,LUPMatrix *this)

{
  bool bVar1;
  ostream *poVar2;
  Matrix local_1f8;
  Permutation local_1d8;
  Matrix local_1c0;
  ostringstream local_190 [8];
  ostringstream out;
  LUPMatrix *this_local;
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  bVar1 = Permutation::IsIdentity(&this->row_permutation_);
  if (!bVar1) {
    Permutation::GetInverse(&local_1d8,&this->row_permutation_);
    Permutation::AsMatrix(&local_1c0,&local_1d8);
    poVar2 = operator<<((ostream *)local_190,&local_1c0);
    poVar2 = std::operator<<(poVar2," \\ \\cdot\\");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    Matrix::~Matrix(&local_1c0);
    Permutation::~Permutation(&local_1d8);
  }
  poVar2 = operator<<((ostream *)local_190,&this->l_);
  poVar2 = std::operator<<(poVar2," \\ \\cdot\\");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  operator<<((ostream *)local_190,&this->u_);
  bVar1 = Permutation::IsIdentity(&this->column_permutation_);
  if (!bVar1) {
    poVar2 = std::operator<<((ostream *)local_190,"\\ \\cdot\\");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    Permutation::AsMatrix(&local_1f8,&this->column_permutation_);
    operator<<((ostream *)local_190,&local_1f8);
    Matrix::~Matrix(&local_1f8);
  }
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return __return_storage_ptr__;
}

Assistant:

std::string LUPMatrix::ToLaTex() const {
  std::ostringstream out;
  if (!row_permutation_.IsIdentity()) {
      out << row_permutation_.GetInverse().AsMatrix() << R"( \ \cdot\)" << std::endl;
  }
  out << l_ << R"( \ \cdot\)" << std::endl;
  out << u_;
  if (!column_permutation_.IsIdentity()) {
      out << R"(\ \cdot\)" << std::endl;
      out << column_permutation_.AsMatrix();
  }

  return out.str();
}